

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFromInnerLoop<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
          (RepeatedPtrFieldBase *this,void **our_elems,void **other_elems,int length,
          int already_allocated)

{
  Arena *arena;
  Model *pMVar1;
  long lVar2;
  ulong uVar3;
  
  if (already_allocated < length) {
    arena = this->arena_;
    lVar2 = 0;
    do {
      pMVar1 = Arena::CreateMaybeMessage<CoreML::Specification::Model>(arena);
      our_elems[already_allocated + lVar2] = pMVar1;
      lVar2 = lVar2 + 1;
    } while (length - already_allocated != (int)lVar2);
  }
  if (0 < length) {
    uVar3 = 0;
    do {
      GenericTypeHandler<CoreML::Specification::Model>::Merge
                ((Model *)other_elems[uVar3],(Model *)our_elems[uVar3]);
      uVar3 = uVar3 + 1;
    } while ((uint)length != uVar3);
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFromInnerLoop(void** our_elems,
                                              void** other_elems, int length,
                                              int already_allocated) {
  if (already_allocated < length) {
    Arena* arena = GetArena();
    typename TypeHandler::Type* elem_prototype =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[0]);
    for (int i = already_allocated; i < length; i++) {
      // Allocate a new empty element that we'll merge into below
      typename TypeHandler::Type* new_elem =
          TypeHandler::NewFromPrototype(elem_prototype, arena);
      our_elems[i] = new_elem;
    }
  }
  // Main loop that does the actual merging
  for (int i = 0; i < length; i++) {
    // Already allocated: use existing element.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        reinterpret_cast<typename TypeHandler::Type*>(our_elems[i]);
    TypeHandler::Merge(*other_elem, new_elem);
  }
}